

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::sr::anon_unknown_0::TextureQueryLodInstance::iterate
          (TestStatus *__return_storage_ptr__,TextureQueryLodInstance *this)

{
  ostringstream *poVar1;
  TextureFormat TVar2;
  Vec4 output;
  undefined1 local_1b8 [384];
  float local_38;
  float local_34;
  
  TVar2 = (TextureFormat)
          ((this->super_TextureQueryInstance).super_ShaderRenderCaseInstance.super_TestInstance.
          m_context)->m_testCtx->m_log;
  poVar1 = (ostringstream *)(local_1b8 + 8);
  local_1b8._0_8_ = TVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Expected: level in range ",0x19);
  tcu::operator<<((ostream *)poVar1,&this->m_levelBounds);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", lod in range ",0xf);
  tcu::operator<<((ostream *)poVar1,&this->m_lodBounds);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x78));
  TextureQueryInstance::render(&this->super_TextureQueryInstance);
  tcu::TextureLevel::getAccess
            ((ConstPixelBufferAccess *)local_1b8,
             &(this->super_TextureQueryInstance).super_ShaderRenderCaseInstance.m_resultImage);
  tcu::ConstPixelBufferAccess::getPixel
            ((ConstPixelBufferAccess *)&local_38,(int)(ConstPixelBufferAccess *)local_1b8,0,0);
  if ((((local_38 < (this->m_levelBounds).m_data[0]) || ((this->m_levelBounds).m_data[1] < local_38)
       ) || (local_34 < (this->m_lodBounds).m_data[0])) ||
     ((this->m_lodBounds).m_data[1] < local_34)) {
    poVar1 = (ostringstream *)(local_1b8 + 8);
    local_1b8._0_8_ = TVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Result: level: ",0xf);
    std::ostream::_M_insert<double>((double)local_38);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", lod: ",7);
    std::ostream::_M_insert<double>((double)local_34);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x78));
    poVar1 = (ostringstream *)(local_1b8 + 8);
    local_1b8._0_8_ = TVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Failed",6);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x78));
    local_1b8._0_8_ = (long)local_1b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Got unexpected result","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_1b8._0_8_,
               (undefined1 *)(local_1b8._8_8_ + local_1b8._0_8_));
  }
  else {
    poVar1 = (ostringstream *)(local_1b8 + 8);
    local_1b8._0_8_ = TVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Passed",6);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x78));
    local_1b8._0_8_ = (long)local_1b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Pass","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_1b8._0_8_,
               (undefined1 *)(local_1b8._8_8_ + local_1b8._0_8_));
  }
  if (local_1b8._0_8_ != (long)local_1b8 + 0x10) {
    operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus TextureQueryLodInstance::iterate (void)
{
	tcu::TestLog&		log		= m_context.getTestContext().getLog();

	log << tcu::TestLog::Message << "Expected: level in range " << m_levelBounds << ", lod in range " << m_lodBounds << tcu::TestLog::EndMessage;

	// render
	TextureQueryInstance::render();

	// test
	{
		const tcu::TextureLevel&	result		= getResultImage();
		const tcu::Vec4				output		= result.getAccess().getPixel(0, 0);
		const float					resLevel	= output.x();
		const float					resLod		= output.y();

		if (de::inRange(resLevel, m_levelBounds[0], m_levelBounds[1]) && de::inRange(resLod, m_lodBounds[0], m_lodBounds[1]))
		{
			// success
			log << tcu::TestLog::Message << "Passed" << tcu::TestLog::EndMessage;
			return tcu::TestStatus::pass("Pass");
		}
		else
		{
			// failure
			log << tcu::TestLog::Message << "Result: level: " << resLevel << ", lod: " << resLod << tcu::TestLog::EndMessage;
			log << tcu::TestLog::Message << "Failed" << tcu::TestLog::EndMessage;
			return tcu::TestStatus::fail("Got unexpected result");
		}
	}
}